

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

uint64_t HyperLogLog::Fnv64(uint8_t *x,size_t l)

{
  ulong local_30;
  size_t i;
  uint64_t fnv64_prime;
  uint64_t fnv64;
  size_t l_local;
  uint8_t *x_local;
  
  fnv64_prime = 0xcbf29ce484222325;
  for (local_30 = 0; local_30 < l; local_30 = local_30 + 1) {
    fnv64_prime = (x[local_30] ^ fnv64_prime) * 0x100000001b3;
  }
  return fnv64_prime;
}

Assistant:

uint64_t HyperLogLog::Fnv64(const uint8_t* x, size_t l)
{
    uint64_t fnv64 = 0xcbf29ce484222325ull;
    const uint64_t fnv64_prime = 0x00000100000001B3ull;

    /* Compute the FNV 64 bit hash */
    for (size_t i = 0; i < l; i++) {
        fnv64 ^= x[i];
        fnv64 *= fnv64_prime;
    }
    return fnv64;
}